

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

bool __thiscall
GraphContigger::solve_unclassified(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  size_type *this_00;
  pointer pNVar1;
  long lVar2;
  SequenceDistanceGraph *pSVar3;
  pointer pvVar4;
  size_type sVar5;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  _Var6;
  ulong uVar7;
  NodeView *x_2;
  pointer pvVar8;
  pointer pvVar9;
  pointer pNVar10;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1;
  bool bVar11;
  long *i;
  __buckets_ptr pp_Var12;
  vector<long,_std::allocator<long>_> *x;
  __node_base *p_Var13;
  NodeView *f;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  sols;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> temp_set;
  SequenceDistanceGraphPath local_198;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  map_values;
  vector<long,_std::allocator<long>_> fnids;
  vector<long,_std::allocator<long>_> tpath;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ns;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  fs;
  _Vector_base<long,_std::allocator<long>_> local_90;
  _Vector_base<long,_std::allocator<long>_> local_78;
  _Vector_base<long,_std::allocator<long>_> local_60;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  pNVar10 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar1 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)(((long)(t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) + ((long)pNVar1 - (long)pNVar10 >> 4)) <
      0xc9) {
    fnids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    fnids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    fnids.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (; pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
      fs._M_h._M_buckets = (__buckets_ptr)pNVar10->id;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&fnids,(long *)&fs);
    }
    fs._M_h._M_buckets = &fs._M_h._M_single_bucket;
    fs._M_h._M_bucket_count = 1;
    fs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    fs._M_h._M_element_count = 0;
    fs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    fs._M_h._M_rehash_policy._M_next_resize = 0;
    fs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pNVar1 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pNVar10 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                   super__Vector_impl_data._M_start; pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
      lVar2 = pNVar10->id;
      Strider::stride_out_in_order
                ((SequenceDistanceGraphPath *)&temp_set,s,(sgNodeID_t)-lVar2,true,true,false);
      ns._M_h._M_bucket_count = (size_type)temp_set._M_h._M_buckets;
      ns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)temp_set._M_h._M_bucket_count;
      ns._M_h._M_element_count = (size_type)temp_set._M_h._M_before_begin._M_nxt;
      temp_set._M_h._M_buckets = (__buckets_ptr)0x0;
      temp_set._M_h._M_bucket_count = 0;
      temp_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      ns._M_h._M_buckets = (__buckets_ptr)-lVar2;
      std::
      _Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<long,std::vector<long,std::allocator<long>>>>
                ((_Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&fs,&ns);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&ns._M_h._M_bucket_count);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&temp_set);
    }
    ns._M_h._M_buckets = &ns._M_h._M_single_bucket;
    ns._M_h._M_bucket_count = 1;
    ns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ns._M_h._M_element_count = 0;
    ns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    ns._M_h._M_rehash_policy._M_next_resize = 0;
    ns._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pNVar1 = (t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = &temp_set._M_h._M_bucket_count;
    for (pNVar10 = (t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                   super__Vector_impl_data._M_start; pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
      tpath.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tpath.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      tpath.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      Strider::stride_out_in_order
                ((SequenceDistanceGraphPath *)&temp_set,s,-pNVar10->id,true,true,false);
      local_198.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)temp_set._M_h._M_buckets;
      local_198.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)temp_set._M_h._M_bucket_count;
      local_198.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)temp_set._M_h._M_before_begin._M_nxt;
      temp_set._M_h._M_buckets = (__buckets_ptr)0x0;
      temp_set._M_h._M_bucket_count = 0;
      temp_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&temp_set);
      for (pp_Var12 = (__buckets_ptr)
                      local_198.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_198.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start + 1 < pp_Var12; pp_Var12 = pp_Var12 + -1) {
        temp_set._M_h._M_buckets = (__buckets_ptr)-(long)pp_Var12[-1];
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)
                   &tpath.super__Vector_base<long,_std::allocator<long>_>,(long *)&temp_set);
      }
      Strider::stride_out_in_order
                ((SequenceDistanceGraphPath *)&temp_set,s,pNVar10->id,true,true,false);
      sVar5 = temp_set._M_h._M_bucket_count;
      for (pp_Var12 = temp_set._M_h._M_buckets; pp_Var12 != (__buckets_ptr)sVar5;
          pp_Var12 = pp_Var12 + 1) {
        sols.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&(*pp_Var12)[-1]._M_nxt + 7);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  ((vector<long,_std::allocator<long>_> *)
                   &tpath.super__Vector_base<long,_std::allocator<long>_>,(long *)&sols);
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&temp_set);
      temp_set._M_h._M_buckets = (__buckets_ptr)pNVar10->id;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)this_00,
                 (vector<long,_std::allocator<long>_> *)
                 &tpath.super__Vector_base<long,_std::allocator<long>_>);
      std::
      _Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<long,std::vector<long,std::allocator<long>>>>
                ((_Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&ns,(SequenceDistanceGraphPath *)&temp_set);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)this_00);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&local_198);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&tpath.super__Vector_base<long,_std::allocator<long>_>);
    }
    sols.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sols.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sols.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    map_values.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_values.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_values.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var13 = &fs._M_h._M_before_begin;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::push_back(&map_values,(value_type *)(p_Var13 + 2));
    }
    p_Var13 = &ns._M_h._M_before_begin;
    while (pvVar9 = map_values.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, p_Var13 = p_Var13->_M_nxt,
          p_Var13 != (__node_base *)0x0) {
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::push_back(&map_values,(value_type *)(p_Var13 + 2));
    }
    for (pvVar8 = map_values.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = sols.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pvVar8 != pvVar9; pvVar8 = pvVar8 + 1)
    {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)&local_48,pvVar8);
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)&local_60,&fnids);
      end_to_end_solution((vector<long,_std::allocator<long>_> *)&temp_set,this,
                          (vector<long,_std::allocator<long>_> *)&local_48,
                          (vector<long,_std::allocator<long>_> *)&local_60);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
      if ((__buckets_ptr)temp_set._M_h._M_bucket_count != temp_set._M_h._M_buckets) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<long,std::allocator<long>>const>>
                          (sols.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           sols.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&temp_set);
        if (_Var6._M_current ==
            sols.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&sols,(value_type *)&temp_set);
        }
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&temp_set);
    }
    temp_set._M_h._M_buckets = &temp_set._M_h._M_single_bucket;
    temp_set._M_h._M_bucket_count = 1;
    temp_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    temp_set._M_h._M_element_count = 0;
    temp_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    temp_set._M_h._M_rehash_policy._M_next_resize = 0;
    temp_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
    for (pvVar9 = sols.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = sols.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pvVar9 != pvVar4; pvVar9 = pvVar9 + 1)
    {
      std::
      _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<long_const&>
                ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&temp_set,
                 (pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start);
    }
    for (pvVar9 = sols.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = sols.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pvVar9 != pvVar8; pvVar9 = pvVar9 + 1)
    {
      tpath.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)-(pvVar9->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_finish[-1];
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_emplace<long>(&temp_set._M_h,&tpath);
    }
    uVar7 = (long)fnids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)fnids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    bVar11 = false;
    if ((((long)sols.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)sols.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar7 >> 1) &&
       (bVar11 = false, temp_set._M_h._M_element_count == uVar7)) {
      for (pvVar9 = sols.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = sols.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pvVar9 != pvVar4; pvVar9 = pvVar9 + 1
          ) {
        pSVar3 = *(SequenceDistanceGraph **)this;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_78,pvVar9);
        std::vector<long,_std::allocator<long>_>::vector
                  (&local_198.nodes,(vector<long,_std::allocator<long>_> *)&local_78);
        local_198.sg = pSVar3;
        SequenceDistanceGraphPath::sequence_abi_cxx11_((string *)&tpath,&local_198);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&local_198);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
        std::__cxx11::string::~string((string *)&tpath);
      }
      for (pvVar9 = sols.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar8; pvVar9 = pvVar9 + 1
          ) {
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_90,pvVar9);
        GraphEditor::queue_path_detachment(ge,(vector<long,_std::allocator<long>_> *)&local_90,true)
        ;
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_90);
      }
      pNVar1 = (t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pNVar10 = (t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                     super__Vector_impl_data._M_start; pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
        GraphEditor::queue_node_deletion(ge,pNVar10->id);
      }
      bVar11 = true;
    }
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&temp_set._M_h);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&map_values);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&sols);
    std::
    _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&ns._M_h);
    std::
    _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&fs._M_h);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&fnids.super__Vector_base<long,_std::allocator<long>_>);
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool GraphContigger::solve_unclassified(TangleView &t, Strider &s, GraphEditor &ge){
    if (t.frontiers.size()+t.internals.size()>200) return false;
    std::vector<sgNodeID_t> fnids;
    for (const auto& f: t.frontiers) fnids.push_back(f.node_id());

//    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> sols;
//    for (const auto& fnid: fnids) sols.insert(std::make_pair(fnid, std::vector<sgNodeID_t>()));
    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> fs;
    for (const auto&f: t.frontiers) {
        fs.insert(std::make_pair(-f.node_id(), s.stride_out_in_order(-f.node_id()).nodes));
    }

    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> ns;
    for (const auto&nv: t.internals){

        std::vector<sgNodeID_t> tpath;
        auto stride_back = s.stride_out_in_order(-nv.node_id()).nodes;
        for (auto i=stride_back.rbegin(); i<stride_back.rend()-1; ++i){
            tpath.push_back(*i*-1);
        }
        for (const auto &i: s.stride_out_in_order(nv.node_id()).nodes){
            tpath.push_back(i-1);
        }
        ns.insert(std::make_pair(nv.node_id(), tpath));
    }

    std::vector<std::vector<sgNodeID_t >> sols;
    std::vector<std::vector<sgNodeID_t>> map_values;
    for (const auto &v: fs){map_values.push_back(v.second);}
    for (const auto &v: ns){map_values.push_back(v.second);}


    for (const auto& x: map_values){
        auto sol=end_to_end_solution(x, fnids);
        if (sol.size()>0 and std::find(sols.begin(), sols.end(), sol)==sols.end()){
            sols.push_back(sol);
        }
    }

    std::unordered_set<sgNodeID_t> temp_set;
    for (const auto &x: sols){
        temp_set.emplace(x[0]);
    }
    for (const auto &x: sols){
        temp_set.emplace(-x.back());
    }

    if (sols.size() == fnids.size()/2 and temp_set.size() == fnids.size()){
        for (const auto &x: sols){
            try {
                auto ps=SequenceDistanceGraphPath(ws.sdg,x).sequence();
            } catch (...) {
                return false;
            }
        }
        for (const auto &x: sols) ge.queue_path_detachment(x, true);
        for (const auto &x: t.internals) ge.queue_node_deletion(x.node_id());
        return true;
    }
    return false;
}